

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void auto_compaction_with_custom_cmp_function(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  char *__format;
  fdb_file_handle *file;
  fdb_kvs_handle *db1;
  fdb_kvs_handle *db3;
  fdb_kvs_handle *db2;
  fdb_kvs_config kvs_config;
  fdb_custom_cmp_variable functions [1];
  char *kvs_names [1];
  fdb_file_info file_info;
  timeval __test_begin;
  char keybuf [256];
  char bodybuf [256];
  fdb_config local_128;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  kvs_names[0] = (char *)0x0;
  functions[0] = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  local_128.wal_threshold = 0x1000;
  local_128.compaction_mode = '\x01';
  local_128.compaction_threshold = '\n';
  local_128.compactor_sleep_duration = 1;
  fVar2 = fdb_open_custom_cmp(&file,"compact_test",&local_128,1,kvs_names,functions,(void **)0x0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x7da);
    auto_compaction_with_custom_cmp_function()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x7da,"void auto_compaction_with_custom_cmp_function()");
  }
  fdb_get_default_kvs_config();
  kvs_config.custom_cmp_param = (void *)keybuf._16_8_;
  kvs_config.create_if_missing = (bool)keybuf[0];
  kvs_config._1_1_ = keybuf[1];
  kvs_config._2_1_ = keybuf[2];
  kvs_config._3_1_ = keybuf[3];
  kvs_config._4_1_ = keybuf[4];
  kvs_config._5_1_ = keybuf[5];
  kvs_config._6_1_ = keybuf[6];
  kvs_config._7_1_ = keybuf[7];
  kvs_config.custom_cmp = (fdb_custom_cmp_variable)keybuf._8_8_;
  fVar2 = fdb_kvs_open_default(file,&db1,&kvs_config);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x7df);
    auto_compaction_with_custom_cmp_function()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x7df,"void auto_compaction_with_custom_cmp_function()");
  }
  fVar2 = fdb_kvs_open(file,&db2,"db",&kvs_config);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x7e1);
    auto_compaction_with_custom_cmp_function()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x7e1,"void auto_compaction_with_custom_cmp_function()");
  }
  uVar6 = 0;
  while (uVar6 != 10000) {
    sprintf(keybuf,"key%06d",(ulong)uVar6);
    sprintf(bodybuf,"body%06d",(ulong)uVar6);
    pfVar1 = db1;
    sVar3 = strlen(keybuf);
    sVar4 = strlen(bodybuf);
    fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
    pfVar1 = db2;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x7e9);
      auto_compaction_with_custom_cmp_function()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x7e9,"void auto_compaction_with_custom_cmp_function()");
    }
    sVar3 = strlen(keybuf);
    sVar4 = strlen(bodybuf);
    fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
    uVar6 = uVar6 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x7ec);
      auto_compaction_with_custom_cmp_function()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x7ec,"void auto_compaction_with_custom_cmp_function()");
    }
  }
  kvs_config.custom_cmp = _compact_test_keycmp;
  fVar2 = fdb_kvs_open(file,&db3,"db_custom",&kvs_config);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x7f3);
    auto_compaction_with_custom_cmp_function()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x7f3,"void auto_compaction_with_custom_cmp_function()");
  }
  sprintf(keybuf,"key%06d",0);
  sprintf(bodybuf,"body%06d",0);
  sVar3 = strlen(keybuf);
  sVar4 = strlen(bodybuf);
  fVar2 = fdb_set_kv(db3,keybuf,sVar3,bodybuf,sVar4);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x7f9);
    auto_compaction_with_custom_cmp_function()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x7f9,"void auto_compaction_with_custom_cmp_function()");
  }
  fVar2 = fdb_commit(file,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x7fd);
    auto_compaction_with_custom_cmp_function()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x7fd,"void auto_compaction_with_custom_cmp_function()");
  }
  uVar5 = 0;
  for (uVar6 = 0; uVar6 != 10000; uVar6 = uVar6 + 1) {
    sprintf(keybuf,"key%06d",(ulong)uVar6);
    sprintf(bodybuf,"body%06d",(ulong)uVar6);
    pfVar1 = db1;
    sVar3 = strlen(keybuf);
    sVar4 = strlen(bodybuf);
    fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3,bodybuf,sVar4);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x805);
      auto_compaction_with_custom_cmp_function()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x805,"void auto_compaction_with_custom_cmp_function()");
    }
    fVar2 = fdb_get_file_info(file,&file_info);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x808);
      auto_compaction_with_custom_cmp_function()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x808,"void auto_compaction_with_custom_cmp_function()");
    }
    if (uVar5 < file_info.file_size) {
      uVar5 = file_info.file_size;
    }
  }
  fVar2 = fdb_commit(file,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x80f);
    auto_compaction_with_custom_cmp_function()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x80f,"void auto_compaction_with_custom_cmp_function()");
  }
  fVar2 = fdb_get_file_info(file,&file_info);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x812);
    auto_compaction_with_custom_cmp_function()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x812,"void auto_compaction_with_custom_cmp_function()");
  }
  if (uVar5 < file_info.file_size) {
    uVar5 = file_info.file_size;
  }
  printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar5);
  do {
    sleep(1);
    fVar2 = fdb_get_file_info(file,&file_info);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x81c);
      auto_compaction_with_custom_cmp_function()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x81c,"void auto_compaction_with_custom_cmp_function()");
    }
  } while (uVar5 <= file_info.file_size);
  fVar2 = fdb_close(file);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      memleak_end();
      __format = "%s PASSED\n";
      if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"auto compaction with custom comparison function");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x827);
    auto_compaction_with_custom_cmp_function()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x827,"void auto_compaction_with_custom_cmp_function()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0x825);
  auto_compaction_with_custom_cmp_function()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x825,"void auto_compaction_with_custom_cmp_function()");
}

Assistant:

void auto_compaction_with_custom_cmp_function()
{
    TEST_INIT();

    memleak_start();

    int i, r, n=10000;
    char keybuf[256], bodybuf[256];
    uint64_t max_filesize = 0;
    fdb_file_handle *file;
    fdb_kvs_handle *db1, *db2, *db3;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_file_info file_info;
    char *kvs_names[] = {NULL};
    fdb_custom_cmp_variable functions[] = {_compact_test_keycmp};

    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // Open Database File
    config = fdb_get_default_config();
    config.wal_threshold = 4096; // reset WAL threshold for correct file size estimation
    config.compaction_mode=FDB_COMPACTION_AUTO;
    config.compactor_sleep_duration = 1;
    config.compaction_threshold = 10;
    status = fdb_open_custom_cmp(&file, "compact_test", &config,
                                 1, kvs_names, functions, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Open 2 KV Stores
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &db1, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(file, &db2, "db", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // initial load
    for(i=0;i<n;i++) {
        sprintf(keybuf, "key%06d", i);
        sprintf(bodybuf, "body%06d", i);
        status = fdb_set_kv(db1, keybuf, strlen(keybuf),
                                 bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_kv(db2, keybuf, strlen(keybuf),
                                 bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // create one more KVS using custom cmp
    // it doesn't exist on the initial cmp_func list
    kvs_config.custom_cmp = _compact_test_keycmp;
    status = fdb_kvs_open(file, &db3, "db_custom", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 0;
    sprintf(keybuf, "key%06d", i);
    sprintf(bodybuf, "body%06d", i);
    status = fdb_set_kv(db3, keybuf, strlen(keybuf),
                             bodybuf, strlen(bodybuf));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Commit
    status = fdb_commit(file, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update to trigger compaction
    for(i=0;i<n;i++) {
        sprintf(keybuf, "key%06d", i);
        sprintf(bodybuf, "body%06d", i);
        status = fdb_set_kv(db1, keybuf, strlen(keybuf),
                                 bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        status = fdb_get_file_info(file, &file_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (file_info.file_size > max_filesize) {
            max_filesize = file_info.file_size;
        }
    }
    // Commit
    status = fdb_commit(file, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_file_info(file, &file_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    if (file_info.file_size > max_filesize) {
        max_filesize = file_info.file_size;
    }

    printf("wait for daemon compaction completion... (max file size: %" _F64 ")\n", max_filesize);
    while (true) {
        sleep(1);

        status = fdb_get_file_info(file, &file_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (file_info.file_size < max_filesize) {
            break;
        }
    }
    // should be compacted
    TEST_CHK(file_info.file_size < max_filesize);

    status = fdb_close(file);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();

    TEST_RESULT("auto compaction with custom comparison function");
}